

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O1

Type * slang::ast::FixedSizeUnpackedArrayType::fromDim
                 (Scope *scope,Type *elementType,ConstantRange dim,DeferredSourceRange sourceRange)

{
  Compilation *this;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint64_t uVar3;
  int iVar4;
  bool bVar5;
  SourceRange sourceRange_00;
  ConstantRange local_48;
  ulong local_40;
  char local_38;
  ulong local_30;
  undefined1 local_28;
  
  local_48 = dim;
  if (elementType->canonical == (Type *)0x0) {
    Type::resolveCanonical(elementType);
  }
  if ((elementType->canonical->super_Symbol).kind != ErrorType) {
    this = scope->compilation;
    uVar3 = Type::getSelectableWidth(elementType);
    iVar4 = local_48.left - local_48.right;
    if (local_48.left - local_48.right == 0 || local_48.left < local_48.right) {
      iVar4 = -(local_48.left - local_48.right);
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar3;
    auVar1 = auVar1 * ZEXT416(iVar4 + 1);
    local_40 = auVar1._0_8_;
    local_38 = auVar1._8_8_ == 0;
    uVar3 = Type::getBitstreamWidth(elementType);
    iVar4 = local_48.left - local_48.right;
    if (local_48.left - local_48.right == 0 || local_48.left < local_48.right) {
      iVar4 = -(local_48.left - local_48.right);
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar3;
    auVar2 = auVar2 * ZEXT416(iVar4 + 1);
    local_30 = auVar2._0_8_;
    bVar5 = auVar2._8_8_ != 0;
    local_28 = !bVar5;
    if (((local_38 != '\x01') || (0x3fffffff8 < local_40 || bVar5)) ||
       (!bVar5 && 0x3fffffff8 < local_30)) {
      sourceRange_00 = slang::syntax::DeferredSourceRange::get(&sourceRange);
      Scope::addDiag(scope,(DiagCode)0x180009,sourceRange_00);
      elementType = this->errorType;
    }
    else {
      elementType = &BumpAllocator::
                     emplace<slang::ast::FixedSizeUnpackedArrayType,slang::ast::Type_const&,slang::ConstantRange&,unsigned_long&,unsigned_long&>
                               (&this->super_BumpAllocator,elementType,&local_48,&local_40,&local_30
                               )->super_Type;
      if ((SyntaxNode *)(sourceRange.node.value & 0xfffffffffffffffe) != (SyntaxNode *)0x0) {
        (((FixedSizeUnpackedArrayType *)elementType)->super_Type).super_Symbol.originatingSyntax =
             (SyntaxNode *)(sourceRange.node.value & 0xfffffffffffffffe);
      }
    }
  }
  return &((FixedSizeUnpackedArrayType *)elementType)->super_Type;
}

Assistant:

const Type& FixedSizeUnpackedArrayType::fromDim(const Scope& scope, const Type& elementType,
                                                ConstantRange dim,
                                                DeferredSourceRange sourceRange) {
    if (elementType.isError())
        return elementType;

    auto& comp = scope.getCompilation();
    auto selectableWidth = checkedMulU64(elementType.getSelectableWidth(), dim.width());
    auto bitstreamWidth = checkedMulU64(elementType.getBitstreamWidth(), dim.width());

    if (!selectableWidth || selectableWidth > MaxBitWidth || !bitstreamWidth ||
        bitstreamWidth > MaxBitWidth) {
        scope.addDiag(diag::ObjectTooLarge, sourceRange.get());
        return comp.getErrorType();
    }

    auto result = comp.emplace<FixedSizeUnpackedArrayType>(elementType, dim, *selectableWidth,
                                                           *bitstreamWidth);
    if (auto syntax = sourceRange.syntax())
        result->setSyntax(*syntax);

    return *result;
}